

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O3

_Bool effect_handler_SINGLE_COMBAT(effect_handler_context_t *context)

{
  player_upkeep *ppVar1;
  chunk_conflict *c;
  player *p;
  uint32_t uVar2;
  wchar_t i2;
  wchar_t i1;
  monster *pmVar3;
  char *fmt;
  chunk *c_00;
  char m_name [80];
  char acStack_78 [88];
  
  pmVar3 = target_get_monster();
  context->ident = true;
  if (player->upkeep->arena_level == true) {
    fmt = "You are already in single combat!";
  }
  else {
    if (pmVar3 != (monster *)0x0) {
      i1 = pmVar3->midx;
      uVar2 = Rand_div(pmVar3->race->spell_power);
      if ((int)player->lev < (int)uVar2) {
        monster_desc(acStack_78,0x50,pmVar3,L'̀');
        msg("%s resists!",acStack_78);
      }
      else {
        if (i1 != L'\x01') {
          pmVar3 = cave_monster(cave,L'\x01');
          c = cave;
          c_00 = (chunk *)cave;
          if (pmVar3->race != (monster_race *)0x0) {
            i2 = cave_monster_max(cave);
            monster_index_move((chunk *)c,i1,i2);
            monster_index_move((chunk *)cave,L'\x01',i1);
            c_00 = (chunk *)cave;
            i1 = cave_monster_max(cave);
          }
          monster_index_move(c_00,i1,L'\x01');
        }
        pmVar3 = cave_monster(cave,L'\x01');
        target_set_monster(pmVar3);
        pmVar3 = cave_monster(cave,L'\x01');
        p = player;
        ppVar1 = player->upkeep;
        ppVar1->health_who = pmVar3;
        ppVar1->arena_level = true;
        p->old_grid = p->grid;
        dungeon_change_level(p,(int)p->depth);
      }
      return true;
    }
    fmt = "No monster selected!";
  }
  msg(fmt);
  return false;
}

Assistant:

bool effect_handler_SINGLE_COMBAT(effect_handler_context_t *context)
{
	struct monster *mon = target_get_monster();
	context->ident = true;

	/* Already in an arena */
	if (player->upkeep->arena_level) {
		msg("You are already in single combat!");
		return false;
	}

	/* Need to choose a monster, not just point */
	if (mon) {
		int old_idx = mon->midx;

		/* Monsters with high spell power can resist */
		if (randint0(mon->race->spell_power) > player->lev) {
			char m_name[80];
			monster_desc(m_name, sizeof(m_name), mon,
				MDESC_CAPITAL | MDESC_COMMA);
			msg("%s resists!", m_name);
			return true;
		}

		/* Swap the targeted monster with the first in the monster list */
		if (old_idx == 1) {
			/* Do nothing */
			;
		} else if (cave_monster(cave, 1)->race) {
			monster_index_move(cave, old_idx, cave_monster_max(cave));
			monster_index_move(cave, 1, old_idx);
			monster_index_move(cave, cave_monster_max(cave), 1);
		} else {
			monster_index_move(cave, old_idx, 1);
		}
		target_set_monster(cave_monster(cave, 1));
		player->upkeep->health_who = cave_monster(cave, 1);
	} else {
		msg("No monster selected!");
		return false;
	}

	/* Head to the arena */
	player->upkeep->arena_level = true;
	player->old_grid = player->grid;
	dungeon_change_level(player, player->depth);
	return true;
}